

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O0

void __thiscall primesieve::MemoryPool::initBuckets(MemoryPool *this,void *memory,size_t bytes)

{
  undefined8 uVar1;
  primesieve_error *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t i;
  Bucket *buckets;
  string *in_stack_ffffffffffffff48;
  Bucket *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  long local_28;
  
  in_RDI[1] = in_RDX >> 0xd;
  local_28 = 0;
  if ((in_RSI & 0x1fff) != 0) {
    uVar1 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    primesieve_error::primesieve_error
              ((primesieve_error *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __cxa_throw(uVar1,&primesieve_error::typeinfo,primesieve_error::~primesieve_error);
  }
  if (9 < in_RDI[1]) {
    for (; local_28 + 1U < in_RDI[1]; local_28 = local_28 + 1) {
      Bucket::reset(in_stack_ffffffffffffff50);
      Bucket::setNext((Bucket *)(in_RSI + local_28 * 0x2000),
                      (Bucket *)(in_RSI + (local_28 + 1) * 0x2000));
    }
    Bucket::reset(in_stack_ffffffffffffff50);
    Bucket::setNext((Bucket *)(in_RSI + local_28 * 0x2000),(Bucket *)0x0);
    *in_RDI = in_RSI;
    return;
  }
  this_00 = (primesieve_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  primesieve_error::primesieve_error(this_00,in_stack_ffffffffffffff48);
  __cxa_throw(this_00,&primesieve_error::typeinfo,primesieve_error::~primesieve_error);
}

Assistant:

void MemoryPool::initBuckets(void* memory, size_t bytes)
{
  Bucket* buckets = (Bucket*) memory;
  count_ = bytes / sizeof(Bucket);
  size_t i = 0;

  if ((size_t) buckets % sizeof(Bucket) != 0)
    throw primesieve_error("MemoryPool: failed to align memory!");

  if (count_ < 10)
    throw primesieve_error("MemoryPool: insufficient buckets allocated!");

  for (; i + 1 < count_; i++)
  {
    buckets[i].reset();
    buckets[i].setNext(&buckets[i + 1]);
  }

  buckets[i].reset();
  buckets[i].setNext(nullptr);
  stock_ = buckets;
}